

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_add_local_cell(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT *nodes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  REF_INT new_cell;
  REF_INT local_c;
  
  lVar4 = (long)ref_cell->node_per;
  if (0 < lVar4) {
    lVar5 = 0;
    bVar6 = false;
    do {
      while (bVar6) {
        lVar5 = lVar5 + 1;
        bVar6 = true;
        if (lVar5 == lVar4) goto LAB_001f6268;
      }
      iVar1 = *(int *)((long)&ref_subdiv->grid->mpi + 4);
      iVar2 = ref_subdiv->edge[1].e2n[nodes[lVar5]];
      bVar6 = iVar1 == iVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar4);
    if (iVar1 == iVar2) {
LAB_001f6268:
      uVar3 = ref_cell_add(ref_cell,nodes,&local_c);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x402,"ref_subdiv_add_local_cell",(ulong)uVar3,"add");
        return uVar3;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_add_local_cell(REF_SUBDIV ref_subdiv,
                                                    REF_CELL ref_cell,
                                                    REF_INT *nodes) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_BOOL has_local;
  REF_INT node, new_cell;

  has_local = REF_FALSE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    has_local = has_local || (ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)) ==
                              ref_node_part(ref_node, nodes[node]));

  if (has_local) RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");

  return REF_SUCCESS;
}